

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

Result<void> * __thiscall
ChainstateManager::PopulateAndValidateSnapshot
          (ChainstateManager *this,Chainstate *snapshot_chainstate,AutoFile *coins_file,
          SnapshotMetadata *metadata)

{
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  uint uVar1;
  bool bVar2;
  uint uVar3;
  CoinsCacheSizeState CVar4;
  _func_int **pp_Var5;
  uint64_t uVar6;
  size_t sVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  Result<void> *in_RDI;
  long in_R8;
  long in_FS_OFFSET;
  int i_1;
  int AFTER_GENESIS_START;
  StopHashingException *anon_var_1_1;
  CCoinsViewDB *snapshot_coinsdb;
  failure *anon_var_1;
  bool out_of_coins;
  failure *anon_var_0;
  CoinsCacheSizeState snapshot_cache_state;
  size_t i;
  size_t coins_per_txid;
  AssumeutxoData *au_data;
  optional<AssumeutxoData> *maybe_au_data;
  CCoinsViewCache *coins_cache;
  CBlockIndex *index;
  byte left_over_byte;
  int64_t coins_processed;
  uint64_t coins_left;
  uint64_t coins_count;
  int base_height;
  CBlockIndex *snapshot_start_block;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock55;
  optional<kernel::CCoinsStats> maybe_stats;
  Coin coin;
  COutPoint outpoint;
  Txid txid;
  uint256 base_blockhash;
  undefined4 in_stack_fffffffffffff1e8;
  undefined4 uVar8;
  undefined2 in_stack_fffffffffffff1ec;
  undefined2 in_stack_fffffffffffff1ee;
  CChainParams *in_stack_fffffffffffff1f0;
  char *error;
  Result<void> *in_stack_fffffffffffff1f8;
  CCoinsViewCache *this_00;
  char *in_stack_fffffffffffff200;
  char *__str;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffff208;
  CCoinsViewCache *in_stack_fffffffffffff210;
  anon_class_16_2_c907b028 *in_stack_fffffffffffff218;
  undefined7 in_stack_fffffffffffff220;
  undefined1 in_stack_fffffffffffff227;
  CCoinsViewCache *in_stack_fffffffffffff228;
  undefined7 in_stack_fffffffffffff230;
  undefined1 in_stack_fffffffffffff237;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff238;
  undefined7 in_stack_fffffffffffff240;
  undefined1 in_stack_fffffffffffff247;
  bilingual_str *in_stack_fffffffffffff248;
  undefined4 in_stack_fffffffffffff250;
  undefined4 in_stack_fffffffffffff254;
  undefined8 in_stack_fffffffffffff258;
  undefined8 in_stack_fffffffffffff270;
  AutoFile *in_stack_fffffffffffff278;
  ConstevalFormatString<3U> in_stack_fffffffffffff298;
  size_t in_stack_fffffffffffff2a0;
  char *in_stack_fffffffffffff2a8;
  size_t in_stack_fffffffffffff2b0;
  char *in_stack_fffffffffffff2b8;
  float local_cf4;
  undefined8 in_stack_fffffffffffff390;
  unsigned_long *in_stack_fffffffffffff3b0;
  _func_int **local_bf8;
  allocator<char> local_afb [18];
  allocator<char> local_ae9;
  undefined1 local_ae8 [48];
  long local_ab8;
  allocator<char> local_aa9;
  long local_aa8;
  allocator<char> local_a9a;
  allocator<char> local_a99;
  undefined1 local_a98 [40];
  undefined1 local_a70 [47];
  allocator<char> local_a41;
  int local_a40;
  allocator<char> local_a39 [9];
  _List_node_base *local_a30;
  _List_node_base local_a28 [113];
  uint local_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  uint local_2e8;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  char local_260 [568];
  _List_node_base local_28;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT26(in_stack_fffffffffffff1ee,
                      CONCAT24(in_stack_fffffffffffff1ec,in_stack_fffffffffffff1e8)));
  PopulateAndValidateSnapshot::anon_class_8_1_9bda152b::operator()
            ((anon_class_8_1_9bda152b *)in_stack_fffffffffffff208);
  local_28._M_next = *(_List_node_base **)(in_R8 + 0x34);
  local_28._M_prev = *(_List_node_base **)(in_R8 + 0x3c);
  local_18 = *(undefined8 *)(in_R8 + 0x44);
  local_10 = *(undefined8 *)(in_R8 + 0x4c);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT26(in_stack_fffffffffffff1ee,
                      CONCAT24(in_stack_fffffffffffff1ec,in_stack_fffffffffffff1e8)));
  local_a30 = &local_28;
  local_a28[0]._M_next =
       (_List_node_base *)
       PopulateAndValidateSnapshot::anon_class_16_2_c907b028::operator()(in_stack_fffffffffffff218);
  if ((CBlockIndex *)local_a28[0]._M_next == (CBlockIndex *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff238,
               (char *)CONCAT17(in_stack_fffffffffffff237,in_stack_fffffffffffff230),
               (allocator<char> *)in_stack_fffffffffffff228);
    Untranslated((string *)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220));
    base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffff1f0);
    tinyformat::format<std::__cxx11::string>
              (in_stack_fffffffffffff248,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff247,in_stack_fffffffffffff240));
    util::Result<void>::Result(in_stack_fffffffffffff1f8,(Error *)in_stack_fffffffffffff1f0);
    util::Error::~Error((Error *)CONCAT26(in_stack_fffffffffffff1ee,
                                          CONCAT24(in_stack_fffffffffffff1ec,
                                                   in_stack_fffffffffffff1e8)));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT26(in_stack_fffffffffffff1ee,
                        CONCAT24(in_stack_fffffffffffff1ec,in_stack_fffffffffffff1e8)));
    bilingual_str::~bilingual_str
              ((bilingual_str *)
               CONCAT26(in_stack_fffffffffffff1ee,
                        CONCAT24(in_stack_fffffffffffff1ec,in_stack_fffffffffffff1e8)));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT26(in_stack_fffffffffffff1ee,
                        CONCAT24(in_stack_fffffffffffff1ec,in_stack_fffffffffffff1e8)));
    std::allocator<char>::~allocator(local_a39);
  }
  else {
    local_a40 = ((CBlockIndex *)local_a28[0]._M_next)->nHeight;
    GetParams((ChainstateManager *)
              CONCAT26(in_stack_fffffffffffff1ee,
                       CONCAT24(in_stack_fffffffffffff1ec,in_stack_fffffffffffff1e8)));
    CChainParams::AssumeutxoForHeight
              (in_stack_fffffffffffff1f0,(int)((ulong)in_stack_fffffffffffff1f8 >> 0x20));
    bVar2 = std::optional::operator_cast_to_bool
                      ((optional<AssumeutxoData> *)
                       CONCAT26(in_stack_fffffffffffff1ee,
                                CONCAT24(in_stack_fffffffffffff1ec,in_stack_fffffffffffff1e8)));
    if (bVar2) {
      std::optional<AssumeutxoData>::operator*
                ((optional<AssumeutxoData> *)
                 CONCAT26(in_stack_fffffffffffff1ee,
                          CONCAT24(in_stack_fffffffffffff1ec,in_stack_fffffffffffff1e8)));
      MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
                ((AnnotatedMixin<std::recursive_mutex> *)
                 CONCAT26(in_stack_fffffffffffff1ee,
                          CONCAT24(in_stack_fffffffffffff1ec,in_stack_fffffffffffff1e8)));
      local_a70._32_8_ = local_a28;
      bVar2 = PopulateAndValidateSnapshot::anon_class_16_2_3f36a430::operator()
                        ((anon_class_16_2_3f36a430 *)
                         CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220));
      if (bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff238,
                   (char *)CONCAT17(in_stack_fffffffffffff237,in_stack_fffffffffffff230),
                   (allocator<char> *)in_stack_fffffffffffff228);
        Untranslated((string *)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220));
        util::Result<void>::Result(in_stack_fffffffffffff1f8,(Error *)in_stack_fffffffffffff1f0);
        util::Error::~Error((Error *)CONCAT26(in_stack_fffffffffffff1ee,
                                              CONCAT24(in_stack_fffffffffffff1ec,
                                                       in_stack_fffffffffffff1e8)));
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT26(in_stack_fffffffffffff1ee,
                            CONCAT24(in_stack_fffffffffffff1ec,in_stack_fffffffffffff1e8)));
        std::allocator<char>::~allocator((allocator<char> *)(local_a70 + 0x17));
      }
      else {
        local_a70._8_8_ = *(ulong *)(in_R8 + 0x58);
        local_a70._0_8_ = *(ulong *)(in_R8 + 0x58);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffff208,in_stack_fffffffffffff200);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffff208,in_stack_fffffffffffff200);
        __str = local_260;
        base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffff1f0);
        this_00 = (CCoinsViewCache *)local_a70;
        error = "[snapshot] loading %d coins from snapshot %s\n";
        uVar8 = 2;
        logging_function._M_str = in_stack_fffffffffffff2b8;
        logging_function._M_len = in_stack_fffffffffffff2b0;
        source_file._M_str = in_stack_fffffffffffff2a8;
        source_file._M_len = in_stack_fffffffffffff2a0;
        LogPrintFormatInternal<unsigned_long,std::__cxx11::string>
                  (logging_function,source_file,(int)((ulong)in_stack_fffffffffffff258 >> 0x20),
                   CONCAT44(in_stack_fffffffffffff254,in_stack_fffffffffffff250),
                   (Level)in_stack_fffffffffffff390,
                   (ConstevalFormatString<2U>)in_stack_fffffffffffff298.fmt,(unsigned_long *)in_RDI,
                   in_RSI);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT26(in_stack_fffffffffffff1ee,CONCAT24(in_stack_fffffffffffff1ec,uVar8)));
        local_a98._0_8_ = (_func_int **)0x0;
        while ((_func_int **)local_a70._0_8_ != (_func_int **)0x0) {
          transaction_identifier<false>::transaction_identifier
                    ((transaction_identifier<false> *)
                     CONCAT26(in_stack_fffffffffffff1ee,CONCAT24(in_stack_fffffffffffff1ec,uVar8)));
          AutoFile::operator>>((AutoFile *)this_00,(transaction_identifier<false> *)error);
          pp_Var5 = (_func_int **)
                    ReadCompactSize<AutoFile>
                              (in_stack_fffffffffffff278,
                               SUB81((ulong)in_stack_fffffffffffff270 >> 0x38,0));
          if ((ulong)local_a70._0_8_ < pp_Var5) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffff238,
                       (char *)CONCAT17(in_stack_fffffffffffff237,in_stack_fffffffffffff230),
                       (allocator<char> *)in_stack_fffffffffffff228);
            Untranslated((string *)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220));
            util::Result<void>::Result((Result<void> *)this_00,(Error *)error);
            util::Error::~Error((Error *)CONCAT26(in_stack_fffffffffffff1ee,
                                                  CONCAT24(in_stack_fffffffffffff1ec,uVar8)));
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT26(in_stack_fffffffffffff1ee,CONCAT24(in_stack_fffffffffffff1ec,uVar8))
                      );
            std::allocator<char>::~allocator(&local_a99);
            goto LAB_007f059a;
          }
          for (local_bf8 = (_func_int **)0x0; local_bf8 < pp_Var5;
              local_bf8 = (_func_int **)((long)local_bf8 + 1)) {
            COutPoint::COutPoint
                      ((COutPoint *)
                       CONCAT26(in_stack_fffffffffffff1ee,CONCAT24(in_stack_fffffffffffff1ec,uVar8))
                      );
            Coin::Coin((Coin *)CONCAT26(in_stack_fffffffffffff1ee,
                                        CONCAT24(in_stack_fffffffffffff1ec,uVar8)));
            uVar6 = ReadCompactSize<AutoFile>
                              (in_stack_fffffffffffff278,
                               SUB81((ulong)in_stack_fffffffffffff270 >> 0x38,0));
            local_2e8 = (uint)uVar6;
            local_2f8 = local_270;
            uStack_2f0 = uStack_268;
            local_308 = local_280;
            uStack_300 = uStack_278;
            AutoFile::operator>>((AutoFile *)this_00,(Coin *)error);
            uVar1 = local_2e8;
            if ((local_a40 < (int)(local_310 >> 1)) ||
               (uVar3 = std::numeric_limits<unsigned_int>::max(), uVar3 <= uVar1)) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (in_stack_fffffffffffff238,
                         (char *)CONCAT17(in_stack_fffffffffffff237,in_stack_fffffffffffff230),
                         (allocator<char> *)in_stack_fffffffffffff228);
              Untranslated((string *)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220));
              local_aa8 = local_a70._8_8_ - local_a70._0_8_;
              tinyformat::format<unsigned_long>
                        (in_stack_fffffffffffff248,
                         (unsigned_long *)
                         CONCAT17(in_stack_fffffffffffff247,in_stack_fffffffffffff240));
              util::Result<void>::Result((Result<void> *)this_00,(Error *)error);
              util::Error::~Error((Error *)CONCAT26(in_stack_fffffffffffff1ee,
                                                    CONCAT24(in_stack_fffffffffffff1ec,uVar8)));
              bilingual_str::~bilingual_str
                        ((bilingual_str *)
                         CONCAT26(in_stack_fffffffffffff1ee,
                                  CONCAT24(in_stack_fffffffffffff1ec,uVar8)));
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT26(in_stack_fffffffffffff1ee,
                                  CONCAT24(in_stack_fffffffffffff1ec,uVar8)));
              std::allocator<char>::~allocator(&local_a9a);
              bVar2 = true;
            }
            else {
              bVar2 = MoneyRange((CAmount *)
                                 CONCAT26(in_stack_fffffffffffff1ee,
                                          CONCAT24(in_stack_fffffffffffff1ec,uVar8)));
              if (bVar2) {
                CCoinsViewCache::EmplaceCoinInternalDANGER
                          (in_stack_fffffffffffff228,
                           (COutPoint *)
                           CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
                           (Coin *)in_stack_fffffffffffff218);
                local_a70._0_8_ = local_a70._0_8_ - 1;
                local_a98._0_8_ = local_a98._0_8_ + 1;
                if ((long)local_a98._0_8_ % 1000000 == 0) {
                  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                            (in_stack_fffffffffffff208,__str);
                  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                            (in_stack_fffffffffffff208,__str);
                  local_cf4 = (float)(ulong)local_a70._8_8_;
                  local_ae8._12_4_ = ((float)(long)local_a98._0_8_ * 100.0) / local_cf4;
                  sVar7 = CCoinsViewCache::DynamicMemoryUsage(this_00);
                  local_ae8._0_8_ = sVar7 / 1000000;
                  in_stack_fffffffffffff208 =
                       (basic_string_view<char,_std::char_traits<char>_> *)local_ae8;
                  __str = local_ae8 + 0xc;
                  this_00 = (CCoinsViewCache *)local_a98;
                  error = "[snapshot] %d coins loaded (%.2f%%, %.2f MB)\n";
                  uVar8 = 2;
                  logging_function_00._M_str = in_stack_fffffffffffff2b8;
                  logging_function_00._M_len = in_stack_fffffffffffff2b0;
                  source_file_00._M_str = in_stack_fffffffffffff2a8;
                  source_file_00._M_len = in_stack_fffffffffffff2a0;
                  LogPrintFormatInternal<long,float,unsigned_long>
                            (logging_function_00,source_file_00,
                             (int)((ulong)in_stack_fffffffffffff258 >> 0x20),
                             CONCAT44(in_stack_fffffffffffff254,in_stack_fffffffffffff250),
                             (Level)in_stack_fffffffffffff390,in_stack_fffffffffffff298,
                             (long *)in_RDI,(float *)in_RSI,in_stack_fffffffffffff3b0);
                }
                if ((long)local_a98._0_8_ % 120000 == 0) {
                  bVar2 = util::SignalInterrupt::operator_cast_to_bool
                                    ((SignalInterrupt *)
                                     CONCAT26(in_stack_fffffffffffff1ee,
                                              CONCAT24(in_stack_fffffffffffff1ec,uVar8)));
                  if (bVar2) {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              (in_stack_fffffffffffff238,
                               (char *)CONCAT17(in_stack_fffffffffffff237,in_stack_fffffffffffff230)
                               ,(allocator<char> *)in_stack_fffffffffffff228);
                    Untranslated((string *)
                                 CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220));
                    util::Result<void>::Result((Result<void> *)this_00,(Error *)error);
                    util::Error::~Error((Error *)CONCAT26(in_stack_fffffffffffff1ee,
                                                          CONCAT24(in_stack_fffffffffffff1ec,uVar8))
                                       );
                    std::__cxx11::string::~string
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT26(in_stack_fffffffffffff1ee,
                                        CONCAT24(in_stack_fffffffffffff1ec,uVar8)));
                    std::allocator<char>::~allocator(&local_ae9);
                    bVar2 = true;
                    goto LAB_007ef71f;
                  }
                  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
                            ((AnnotatedMixin<std::recursive_mutex> *)
                             CONCAT26(in_stack_fffffffffffff1ee,
                                      CONCAT24(in_stack_fffffffffffff1ec,uVar8)));
                  CVar4 = PopulateAndValidateSnapshot::anon_class_8_1_9bda152b::operator()
                                    ((anon_class_8_1_9bda152b *)in_stack_fffffffffffff208);
                  if (1 < (int)CVar4) {
                    GetRandHash();
                    CCoinsViewCache::SetBestBlock
                              ((CCoinsViewCache *)
                               CONCAT26(in_stack_fffffffffffff1ee,
                                        CONCAT24(in_stack_fffffffffffff1ec,uVar8)),
                               (uint256 *)0x7ef6fd);
                    FlushSnapshotToDisk(in_stack_fffffffffffff210,
                                        SUB81((ulong)in_stack_fffffffffffff208 >> 0x38,0));
                  }
                }
                bVar2 = false;
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          (in_stack_fffffffffffff238,
                           (char *)CONCAT17(in_stack_fffffffffffff237,in_stack_fffffffffffff230),
                           (allocator<char> *)in_stack_fffffffffffff228);
                Untranslated((string *)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220)
                            );
                local_ab8 = local_a70._8_8_ - local_a70._0_8_;
                tinyformat::format<unsigned_long>
                          (in_stack_fffffffffffff248,
                           (unsigned_long *)
                           CONCAT17(in_stack_fffffffffffff247,in_stack_fffffffffffff240));
                util::Result<void>::Result((Result<void> *)this_00,(Error *)error);
                util::Error::~Error((Error *)CONCAT26(in_stack_fffffffffffff1ee,
                                                      CONCAT24(in_stack_fffffffffffff1ec,uVar8)));
                bilingual_str::~bilingual_str
                          ((bilingual_str *)
                           CONCAT26(in_stack_fffffffffffff1ee,
                                    CONCAT24(in_stack_fffffffffffff1ec,uVar8)));
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT26(in_stack_fffffffffffff1ee,
                                    CONCAT24(in_stack_fffffffffffff1ec,uVar8)));
                std::allocator<char>::~allocator(&local_aa9);
                bVar2 = true;
              }
            }
LAB_007ef71f:
            Coin::~Coin((Coin *)CONCAT26(in_stack_fffffffffffff1ee,
                                         CONCAT24(in_stack_fffffffffffff1ec,uVar8)));
            if (bVar2) goto LAB_007f059a;
          }
        }
        CCoinsViewCache::SetBestBlock
                  ((CCoinsViewCache *)
                   CONCAT26(in_stack_fffffffffffff1ee,CONCAT24(in_stack_fffffffffffff1ec,uVar8)),
                   (uint256 *)0x7ef92d);
        AutoFile::operator>>((AutoFile *)this_00,(byte *)error);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff238,
                   (char *)CONCAT17(in_stack_fffffffffffff237,in_stack_fffffffffffff230),
                   (allocator<char> *)in_stack_fffffffffffff228);
        Untranslated((string *)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220));
        tinyformat::format<unsigned_long>
                  (in_stack_fffffffffffff248,
                   (unsigned_long *)CONCAT17(in_stack_fffffffffffff247,in_stack_fffffffffffff240));
        util::Result<void>::Result((Result<void> *)this_00,(Error *)error);
        util::Error::~Error((Error *)CONCAT26(in_stack_fffffffffffff1ee,
                                              CONCAT24(in_stack_fffffffffffff1ec,uVar8)));
        bilingual_str::~bilingual_str
                  ((bilingual_str *)
                   CONCAT26(in_stack_fffffffffffff1ee,CONCAT24(in_stack_fffffffffffff1ec,uVar8)));
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT26(in_stack_fffffffffffff1ee,CONCAT24(in_stack_fffffffffffff1ec,uVar8)));
        std::allocator<char>::~allocator(local_afb);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff238,
                 (char *)CONCAT17(in_stack_fffffffffffff237,in_stack_fffffffffffff230),
                 (allocator<char> *)in_stack_fffffffffffff228);
      Untranslated((string *)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220));
      tinyformat::format<int>
                (in_stack_fffffffffffff248,
                 (int *)CONCAT17(in_stack_fffffffffffff247,in_stack_fffffffffffff240));
      util::Result<void>::Result(in_stack_fffffffffffff1f8,(Error *)in_stack_fffffffffffff1f0);
      util::Error::~Error((Error *)CONCAT26(in_stack_fffffffffffff1ee,
                                            CONCAT24(in_stack_fffffffffffff1ec,
                                                     in_stack_fffffffffffff1e8)));
      bilingual_str::~bilingual_str
                ((bilingual_str *)
                 CONCAT26(in_stack_fffffffffffff1ee,
                          CONCAT24(in_stack_fffffffffffff1ec,in_stack_fffffffffffff1e8)));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT26(in_stack_fffffffffffff1ee,
                          CONCAT24(in_stack_fffffffffffff1ec,in_stack_fffffffffffff1e8)));
      std::allocator<char>::~allocator(&local_a41);
    }
  }
LAB_007f059a:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

util::Result<void> ChainstateManager::PopulateAndValidateSnapshot(
    Chainstate& snapshot_chainstate,
    AutoFile& coins_file,
    const SnapshotMetadata& metadata)
{
    // It's okay to release cs_main before we're done using `coins_cache` because we know
    // that nothing else will be referencing the newly created snapshot_chainstate yet.
    CCoinsViewCache& coins_cache = *WITH_LOCK(::cs_main, return &snapshot_chainstate.CoinsTip());

    uint256 base_blockhash = metadata.m_base_blockhash;

    CBlockIndex* snapshot_start_block = WITH_LOCK(::cs_main, return m_blockman.LookupBlockIndex(base_blockhash));

    if (!snapshot_start_block) {
        // Needed for ComputeUTXOStats to determine the
        // height and to avoid a crash when base_blockhash.IsNull()
        return util::Error{strprintf(Untranslated("Did not find snapshot start blockheader %s"),
                  base_blockhash.ToString())};
    }

    int base_height = snapshot_start_block->nHeight;
    const auto& maybe_au_data = GetParams().AssumeutxoForHeight(base_height);

    if (!maybe_au_data) {
        return util::Error{strprintf(Untranslated("Assumeutxo height in snapshot metadata not recognized "
                  "(%d) - refusing to load snapshot"), base_height)};
    }

    const AssumeutxoData& au_data = *maybe_au_data;

    // This work comparison is a duplicate check with the one performed later in
    // ActivateSnapshot(), but is done so that we avoid doing the long work of staging
    // a snapshot that isn't actually usable.
    if (WITH_LOCK(::cs_main, return !CBlockIndexWorkComparator()(ActiveTip(), snapshot_start_block))) {
        return util::Error{Untranslated("Work does not exceed active chainstate")};
    }

    const uint64_t coins_count = metadata.m_coins_count;
    uint64_t coins_left = metadata.m_coins_count;

    LogPrintf("[snapshot] loading %d coins from snapshot %s\n", coins_left, base_blockhash.ToString());
    int64_t coins_processed{0};

    while (coins_left > 0) {
        try {
            Txid txid;
            coins_file >> txid;
            size_t coins_per_txid{0};
            coins_per_txid = ReadCompactSize(coins_file);

            if (coins_per_txid > coins_left) {
                return util::Error{Untranslated("Mismatch in coins count in snapshot metadata and actual snapshot data")};
            }

            for (size_t i = 0; i < coins_per_txid; i++) {
                COutPoint outpoint;
                Coin coin;
                outpoint.n = static_cast<uint32_t>(ReadCompactSize(coins_file));
                outpoint.hash = txid;
                coins_file >> coin;
                if (coin.nHeight > base_height ||
                    outpoint.n >= std::numeric_limits<decltype(outpoint.n)>::max() // Avoid integer wrap-around in coinstats.cpp:ApplyHash
                ) {
                    return util::Error{strprintf(Untranslated("Bad snapshot data after deserializing %d coins"),
                              coins_count - coins_left)};
                }
                if (!MoneyRange(coin.out.nValue)) {
                    return util::Error{strprintf(Untranslated("Bad snapshot data after deserializing %d coins - bad tx out value"),
                              coins_count - coins_left)};
                }
                coins_cache.EmplaceCoinInternalDANGER(std::move(outpoint), std::move(coin));

                --coins_left;
                ++coins_processed;

                if (coins_processed % 1000000 == 0) {
                    LogPrintf("[snapshot] %d coins loaded (%.2f%%, %.2f MB)\n",
                        coins_processed,
                        static_cast<float>(coins_processed) * 100 / static_cast<float>(coins_count),
                        coins_cache.DynamicMemoryUsage() / (1000 * 1000));
                }

                // Batch write and flush (if we need to) every so often.
                //
                // If our average Coin size is roughly 41 bytes, checking every 120,000 coins
                // means <5MB of memory imprecision.
                if (coins_processed % 120000 == 0) {
                    if (m_interrupt) {
                        return util::Error{Untranslated("Aborting after an interrupt was requested")};
                    }

                    const auto snapshot_cache_state = WITH_LOCK(::cs_main,
                        return snapshot_chainstate.GetCoinsCacheSizeState());

                    if (snapshot_cache_state >= CoinsCacheSizeState::CRITICAL) {
                        // This is a hack - we don't know what the actual best block is, but that
                        // doesn't matter for the purposes of flushing the cache here. We'll set this
                        // to its correct value (`base_blockhash`) below after the coins are loaded.
                        coins_cache.SetBestBlock(GetRandHash());

                        // No need to acquire cs_main since this chainstate isn't being used yet.
                        FlushSnapshotToDisk(coins_cache, /*snapshot_loaded=*/false);
                    }
                }
            }
        } catch (const std::ios_base::failure&) {
            return util::Error{strprintf(Untranslated("Bad snapshot format or truncated snapshot after deserializing %d coins"),
                      coins_processed)};
        }
    }

    // Important that we set this. This and the coins_cache accesses above are
    // sort of a layer violation, but either we reach into the innards of
    // CCoinsViewCache here or we have to invert some of the Chainstate to
    // embed them in a snapshot-activation-specific CCoinsViewCache bulk load
    // method.
    coins_cache.SetBestBlock(base_blockhash);

    bool out_of_coins{false};
    try {
        std::byte left_over_byte;
        coins_file >> left_over_byte;
    } catch (const std::ios_base::failure&) {
        // We expect an exception since we should be out of coins.
        out_of_coins = true;
    }
    if (!out_of_coins) {
        return util::Error{strprintf(Untranslated("Bad snapshot - coins left over after deserializing %d coins"),
            coins_count)};
    }

    LogPrintf("[snapshot] loaded %d (%.2f MB) coins from snapshot %s\n",
        coins_count,
        coins_cache.DynamicMemoryUsage() / (1000 * 1000),
        base_blockhash.ToString());

    // No need to acquire cs_main since this chainstate isn't being used yet.
    FlushSnapshotToDisk(coins_cache, /*snapshot_loaded=*/true);

    assert(coins_cache.GetBestBlock() == base_blockhash);

    // As above, okay to immediately release cs_main here since no other context knows
    // about the snapshot_chainstate.
    CCoinsViewDB* snapshot_coinsdb = WITH_LOCK(::cs_main, return &snapshot_chainstate.CoinsDB());

    std::optional<CCoinsStats> maybe_stats;

    try {
        maybe_stats = ComputeUTXOStats(
            CoinStatsHashType::HASH_SERIALIZED, snapshot_coinsdb, m_blockman, [&interrupt = m_interrupt] { SnapshotUTXOHashBreakpoint(interrupt); });
    } catch (StopHashingException const&) {
        return util::Error{Untranslated("Aborting after an interrupt was requested")};
    }
    if (!maybe_stats.has_value()) {
        return util::Error{Untranslated("Failed to generate coins stats")};
    }

    // Assert that the deserialized chainstate contents match the expected assumeutxo value.
    if (AssumeutxoHash{maybe_stats->hashSerialized} != au_data.hash_serialized) {
        return util::Error{strprintf(Untranslated("Bad snapshot content hash: expected %s, got %s"),
            au_data.hash_serialized.ToString(), maybe_stats->hashSerialized.ToString())};
    }

    snapshot_chainstate.m_chain.SetTip(*snapshot_start_block);

    // The remainder of this function requires modifying data protected by cs_main.
    LOCK(::cs_main);

    // Fake various pieces of CBlockIndex state:
    CBlockIndex* index = nullptr;

    // Don't make any modifications to the genesis block since it shouldn't be
    // necessary, and since the genesis block doesn't have normal flags like
    // BLOCK_VALID_SCRIPTS set.
    constexpr int AFTER_GENESIS_START{1};

    for (int i = AFTER_GENESIS_START; i <= snapshot_chainstate.m_chain.Height(); ++i) {
        index = snapshot_chainstate.m_chain[i];

        // Fake BLOCK_OPT_WITNESS so that Chainstate::NeedsRedownload()
        // won't ask for -reindex on startup.
        if (DeploymentActiveAt(*index, *this, Consensus::DEPLOYMENT_SEGWIT)) {
            index->nStatus |= BLOCK_OPT_WITNESS;
        }

        m_blockman.m_dirty_blockindex.insert(index);
        // Changes to the block index will be flushed to disk after this call
        // returns in `ActivateSnapshot()`, when `MaybeRebalanceCaches()` is
        // called, since we've added a snapshot chainstate and therefore will
        // have to downsize the IBD chainstate, which will result in a call to
        // `FlushStateToDisk(ALWAYS)`.
    }

    assert(index);
    assert(index == snapshot_start_block);
    index->m_chain_tx_count = au_data.m_chain_tx_count;
    snapshot_chainstate.setBlockIndexCandidates.insert(snapshot_start_block);

    LogPrintf("[snapshot] validated snapshot (%.2f MB)\n",
        coins_cache.DynamicMemoryUsage() / (1000 * 1000));
    return {};
}